

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::align(bigint *this,bigint *other)

{
  int iVar1;
  make_unsigned_t<int> mVar2;
  size_t sVar3;
  uint *puVar4;
  long in_RSI;
  buffer<unsigned_int> *in_RDI;
  int j;
  int i;
  int num_bigits;
  int exp_difference;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar5;
  int local_20;
  int local_1c;
  
  iVar1 = (int)in_RDI[5].size_ - *(int *)(in_RSI + 0xa8);
  if (0 < iVar1) {
    sVar3 = buffer<unsigned_int>::size(in_RDI);
    to_unsigned<int>(0);
    basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::resize
              ((basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_1c = (int)sVar3 + -1;
    local_20 = local_1c + iVar1;
    for (; -1 < local_1c; local_1c = local_1c + -1) {
      puVar4 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_1c);
      uVar5 = *puVar4;
      puVar4 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_20);
      *puVar4 = uVar5;
      local_20 = local_20 + -1;
    }
    puVar4 = buffer<unsigned_int>::data(in_RDI);
    mVar2 = to_unsigned<int>(0);
    memset(puVar4,0,(ulong)mVar2 << 2);
    *(int *)&in_RDI[5].size_ = (int)in_RDI[5].size_ - iVar1;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    memset(bigits_.data(), 0, to_unsigned(exp_difference) * sizeof(bigit));
    exp_ -= exp_difference;
  }